

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall flatbuffers::StructDef::~StructDef(StructDef *this)

{
  StructDef *this_local;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&this->reserved_ids);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&this->original_location);
  SymbolTable<flatbuffers::FieldDef>::~SymbolTable(&this->fields);
  Definition::~Definition(&this->super_Definition);
  return;
}

Assistant:

StructDef()
      : fixed(false),
        predecl(true),
        sortbysize(true),
        has_key(false),
        minalign(1),
        bytesize(0) {}